

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O2

size_t asio::detail::
       write_buffer_sequence<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::mutable_buffer_const*,asio::detail::transfer_all_t>
                 (basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                  *s,long *buffers,undefined8 param_3,error_code *param_4)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  error_category *peVar4;
  size_t sVar5;
  size_t offset;
  ulong uVar6;
  const_buffers_1 local_40;
  
  peVar4 = (error_category *)std::_V2::system_category();
  param_4->_M_value = 0;
  param_4->_M_cat = peVar4;
  lVar1 = *buffers;
  uVar2 = buffers[1];
  uVar6 = 0;
  iVar3 = 0;
  while ((local_40.super_const_buffer.size_ = uVar2 - uVar6,
         uVar6 <= uVar2 && local_40.super_const_buffer.size_ != 0 && (iVar3 == 0))) {
    local_40.super_const_buffer.data_ = (void *)(uVar6 + lVar1);
    if (0xffff < local_40.super_const_buffer.size_) {
      local_40.super_const_buffer.size_ = 0x10000;
    }
    sVar5 = basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
            ::write_some<asio::const_buffers_1>(s,&local_40,param_4);
    uVar6 = uVar6 + sVar5;
    iVar3 = param_4->_M_value;
  }
  return uVar6;
}

Assistant:

std::size_t write_buffer_sequence(SyncWriteStream& s,
      const ConstBufferSequence& buffers, const ConstBufferIterator&,
      CompletionCondition completion_condition, asio::error_code& ec)
  {
    ec = asio::error_code();
    asio::detail::consuming_buffers<const_buffer,
        ConstBufferSequence, ConstBufferIterator> tmp(buffers);
    while (!tmp.empty())
    {
      if (std::size_t max_size = detail::adapt_completion_condition_result(
            completion_condition(ec, tmp.total_consumed())))
        tmp.consume(s.write_some(tmp.prepare(max_size), ec));
      else
        break;
    }
    return tmp.total_consumed();;
  }